

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_copy_attribute
               (xml_attribute_struct *da,xml_attribute_struct *sa)

{
  xml_allocator *alloc_00;
  xml_attribute_struct *in_RSI;
  xml_attribute_struct *in_RDI;
  uintptr_t unaff_retaddr;
  unsigned_long *in_stack_00000008;
  char **in_stack_00000010;
  xml_allocator *shared_alloc;
  xml_allocator *alloc;
  
  alloc_00 = get_allocator<pugi::xml_attribute_struct>(in_RDI);
  get_allocator<pugi::xml_attribute_struct>(in_RSI);
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(char_t *)in_RDI,&in_RSI->header,
             alloc_00);
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(char_t *)in_RDI,&in_RSI->header,
             alloc_00);
  return;
}

Assistant:

PUGI_IMPL_FN void node_copy_attribute(xml_attribute_struct* da, xml_attribute_struct* sa)
	{
		xml_allocator& alloc = get_allocator(da);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sa)) ? &alloc : NULL;

		node_copy_string(da->name, da->header, xml_memory_page_name_allocated_mask, sa->name, sa->header, shared_alloc);
		node_copy_string(da->value, da->header, xml_memory_page_value_allocated_mask, sa->value, sa->header, shared_alloc);
	}